

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O2

Metric * __thiscall hta::Directory::operator[](Directory *this,string *name)

{
  pointer ppVar1;
  __type_conflict _Var2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
  _Var3;
  pointer __lhs;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_false,_true>,_bool>
  pVar4;
  lock_guard<hta::OptionalMutex> guard;
  Metric metric;
  lock_guard<hta::OptionalMutex> local_b8;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,hta::Metric>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  Metric local_88;
  
  local_b8._M_device = &this->mutex_;
  OptionalMutex::lock(local_b8._M_device);
  _Var3._M_cur = (__node_type *)
                 std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->metrics_)._M_h,name);
  if (_Var3._M_cur == (__node_type *)0x0) {
    __lhs = (this->prefixes_).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->prefixes_).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_b0 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,hta::Metric>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->metrics_;
    while( true ) {
      if (__lhs == ppVar1) {
        std::__cxx11::string::string((string *)&local_a8,(string *)name);
        throw_exception<hta::MissingMetricConfig,char_const*,std::__cxx11::string>
                  ("no settings found to create metric ",&local_a8);
      }
      std::__cxx11::string::substr((ulong)&local_88,(ulong)name);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      if (_Var2) break;
      __lhs = __lhs + 1;
    }
    make_metric(&local_88,this,name,&__lhs->second);
    pVar4 = std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,hta::Metric>,std::allocator<std::pair<std::__cxx11::string_const,hta::Metric>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::__cxx11::string_const&,hta::Metric>(local_b0,name,&local_88);
    _Var3._M_cur = (__node_type *)
                   pVar4.first.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
                   ._M_cur;
    if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("it.second",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/directory.cpp"
                    ,0xa5,"Metric &hta::Directory::operator[](const std::string &)");
    }
    Metric::~Metric(&local_88);
  }
  std::lock_guard<hta::OptionalMutex>::~lock_guard(&local_b8);
  return (Metric *)
         ((long)&((_Var3._M_cur)->
                 super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>,_true>
                 ).
                 super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hta::Metric>_>
                 ._M_storage._M_storage + 0x20);
}

Assistant:

Metric& Directory::operator[](const std::string& name)
{
    std::lock_guard<OptionalMutex> guard(mutex_);
    if (auto it = metrics_.find(name); it != metrics_.end())
    {
        return it->second;
    }
    for (const auto& elem : prefixes_)
    {
        const auto& prefix = elem.first;
        if (prefix == name.substr(0, prefix.size()))
        {
            Metric metric = make_metric(name, elem.second);
            {
                auto it = metrics_.emplace(name, std::move(metric));
                assert(it.second);
                return it.first->second;
            }
        }
    }
    throw_exception<MissingMetricConfig>("no settings found to create metric ", name);
}